

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_tab.c
# Opt level: O0

TValue * lj_tab_setinth(lua_State *L,GCtab *t,int32_t key)

{
  uint uVar1;
  TValue *pTVar2;
  Node *pNVar3;
  TValue *local_58;
  Node *n;
  TValue k;
  GCtab *pGStack_40;
  int32_t key_local;
  GCtab *t_local;
  lua_State *L_local;
  uint64_t local_28;
  Node *n_1;
  GCtab *local_18;
  uint local_10;
  uint local_c;
  
  pNVar3 = (Node *)(double)key;
  n._0_4_ = (uint)pNVar3;
  n._4_4_ = (int)((ulong)pNVar3 >> 0x20);
  uVar1 = n._4_4_ << 0xf | (uint)(n._4_4_ << 1) >> 0x12;
  local_c = (n._4_4_ << 1 ^ (uint)n) - uVar1;
  n_1._4_4_ = (local_c ^ (uVar1 << 5 | (uint)(n._4_4_ << 0xf) >> 0x1b)) -
              (local_c * 0x2000 | local_c >> 0x13);
  local_28 = (t->node).ptr64;
  local_58 = (TValue *)(local_28 + (ulong)(n_1._4_4_ & t->hmask) * 0x18);
  while (((0xfffffff1 < (uint)((int)local_58[1].field_4.it >> 0xf) ||
          (local_58[1].n != (double)pNVar3)) || (NAN(local_58[1].n) || NAN((double)pNVar3)))) {
    local_58 = (TValue *)local_58[2].u64;
    if (local_58 == (TValue *)0x0) {
      n = pNVar3;
      k.field_4.it = key;
      pGStack_40 = t;
      t_local = (GCtab *)L;
      local_18 = t;
      local_10 = n_1._4_4_;
      pTVar2 = lj_tab_newkey(L,t,(cTValue *)&n);
      return pTVar2;
    }
  }
  return local_58;
}

Assistant:

TValue *lj_tab_setinth(lua_State *L, GCtab *t, int32_t key)
{
  TValue k;
  Node *n;
  k.n = (lua_Number)key;
  n = hashnum(t, &k);
  do {
    if (tvisnum(&n->key) && n->key.n == k.n)
      return &n->val;
  } while ((n = nextnode(n)));
  return lj_tab_newkey(L, t, &k);
}